

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

void __thiscall
flatbuffers::GenerateRustModuleRootFile(flatbuffers::Parser_const&,std::__cxx11::string_const&)::
Module::Insert(flatbuffers::Namer_const&,flatbuffers::Definition_const__
          (void *this,Namer *namer,Definition *s)

{
  _Base_ptr *pp_Var1;
  _Link_type __rhs;
  _Link_type __rhs_00;
  _Base_ptr p_Var2;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  Namespace *pNVar7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  _Link_type __p;
  pointer pbVar11;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar12;
  string ns_component;
  
  pNVar7 = s->defined_namespace;
  pbVar11 = (pNVar7->components).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar11 ==
        (pNVar7->components).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      (*namer->_vptr_Namer[0xc])(&ns_component,namer,s,2);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &((_Rb_tree_node_base *)((long)this + 0x20))->_M_left,&ns_component);
      std::__cxx11::string::~string((string *)&ns_component);
      return;
    }
    (*namer->_vptr_Namer[9])(&ns_component,namer,pbVar11);
    pp_Var1 = &((_Rb_tree_node_base *)this)->_M_parent;
    p_Var9 = (_Rb_tree_node_base *)pp_Var1;
    p_Var8 = (_Rb_tree_node_base *)this;
    while( true ) {
      pVar3.second = p_Var9;
      pVar3.first = p_Var9;
      p_Var2 = p_Var8->_M_left;
      if (p_Var2 == (_Base_ptr)0x0) break;
      bVar6 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var2 + 1),&ns_component);
      if (!bVar6) {
        p_Var9 = p_Var2;
      }
      p_Var8 = (_Rb_tree_node_base *)(&p_Var2->_M_color + (ulong)bVar6 * 2);
    }
    if ((p_Var9 == (_Rb_tree_node_base *)pp_Var1) ||
       (bVar6 = std::operator<(&ns_component,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (p_Var9 + 1)), bVar6)) {
      p_Var8 = (_Rb_tree_node_base *)operator_new(0x88);
      __rhs = (_Link_type)(p_Var8 + 1);
      std::__cxx11::string::string((string *)__rhs,(string *)&ns_component);
      p_Var8[2]._M_left = (_Base_ptr)0x0;
      *(undefined8 *)(p_Var8 + 2) = 0;
      p_Var8[2]._M_parent = (_Base_ptr)0x0;
      p_Var8[2]._M_right = (_Base_ptr)&p_Var8[2]._M_parent;
      *(_Base_ptr **)(p_Var8 + 3) = &p_Var8[2]._M_parent;
      p_Var8[3]._M_parent = (_Base_ptr)0x0;
      p_Var8[3]._M_left = (_Base_ptr)0x0;
      p_Var8[3]._M_right = (_Base_ptr)0x0;
      *(undefined8 *)(p_Var8 + 4) = 0;
      if (p_Var9 == (_Rb_tree_node_base *)pp_Var1) {
        if ((((_Rb_tree_node_base *)((long)this + 0x20))->_M_parent == (_Base_ptr)0x0) ||
           (__p = __rhs,
           bVar6 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(*(long *)((long)this + 0x20) + 0x20),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__rhs), !bVar6)) {
LAB_001f3ad0:
          __p = __rhs;
          pVar12 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>_>
                   ::_M_get_insert_unique_pos
                             ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>_>
                               *)this,(key_type *)__rhs);
        }
        else {
          p_Var10 = *(_Rb_tree_node_base **)((long)this + 0x20);
LAB_001f3ac8:
          auVar5._8_8_ = 0;
          auVar5._0_8_ = p_Var10;
          pVar12 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar5 << 0x40);
        }
LAB_001f3adb:
        p_Var9 = pVar12.first;
        if (pVar12.second == (_Rb_tree_node_base *)0x0) {
LAB_001f3b06:
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>_>
          ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>_>
                          *)p_Var8,__p);
          goto LAB_001f3b33;
        }
      }
      else {
        __rhs_00 = (_Link_type)(p_Var9 + 1);
        __p = __rhs_00;
        bVar6 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __rhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)__rhs_00);
        if (!bVar6) {
          __p = __rhs;
          bVar6 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__rhs_00,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__rhs);
          if (bVar6) {
            p_Var10 = *(_Rb_tree_node_base **)((long)this + 0x20);
            if (p_Var10 == p_Var9) goto LAB_001f3ac8;
            p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
            pVar12.second = p_Var10;
            pVar12.first = p_Var10;
            __p = (_Link_type)(p_Var10 + 1);
            bVar6 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__rhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)__p);
            if (!bVar6) goto LAB_001f3ad0;
            if (p_Var9->_M_right == (_Base_ptr)0x0) goto LAB_001f3abf;
            goto LAB_001f3adb;
          }
          goto LAB_001f3b06;
        }
        p_Var2 = ((_Rb_tree_node_base *)this)->_M_right;
        pVar12.second = p_Var2;
        pVar12.first = p_Var2;
        if (p_Var2 == p_Var9) goto LAB_001f3adb;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var9);
        __p = __rhs;
        bVar6 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (p_Var9 + 1),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __rhs);
        if (!bVar6) goto LAB_001f3ad0;
        pVar12 = pVar3;
        if (p_Var9->_M_right != (_Base_ptr)0x0) goto LAB_001f3adb;
LAB_001f3abf:
        auVar4._8_8_ = 0;
        auVar4._0_8_ = p_Var9;
        pVar12 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar4 << 0x40);
      }
      p_Var9 = pVar12.second;
      bVar6 = true;
      if ((pVar12.first == (_Rb_tree_node_base *)0x0) && ((_Rb_tree_node_base *)pp_Var1 != p_Var9))
      {
        bVar6 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __rhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(p_Var9 + 1));
      }
      std::_Rb_tree_insert_and_rebalance(bVar6,p_Var8,p_Var9,(_Rb_tree_node_base *)pp_Var1);
      ((_Rb_tree_node_base *)((long)this + 0x20))->_M_parent =
           (_Base_ptr)((long)&((_Rb_tree_node_base *)((long)this + 0x20))->_M_parent->_M_color + 1);
      p_Var9 = p_Var8;
    }
LAB_001f3b33:
    this = p_Var9 + 2;
    std::__cxx11::string::~string((string *)&ns_component);
    pbVar11 = pbVar11 + 1;
    pNVar7 = s->defined_namespace;
  } while( true );
}

Assistant:

void Insert(const Namer &namer, const Definition *s) {
      const Definition &symbol = *s;
      Module *current_module = this;
      for (auto it = symbol.defined_namespace->components.begin();
           it != symbol.defined_namespace->components.end(); it++) {
        std::string ns_component = namer.Namespace(*it);
        current_module = &current_module->sub_modules[ns_component];
      }
      current_module->generated_files.push_back(
          namer.File(symbol.name, SkipFile::Extension));
    }